

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcBooleanResult::~IfcBooleanResult(IfcBooleanResult *this)

{
  ~IfcBooleanResult((IfcBooleanResult *)
                    &this[-1].SecondOperand.
                     super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  return;
}

Assistant:

IfcBooleanResult() : Object("IfcBooleanResult") {}